

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void Omega_h::fill_linear<double>(Write<double> *a,double offset,double stride)

{
  undefined1 local_58 [8];
  type_conflict2 f;
  double stride_local;
  double offset_local;
  Write<double> *a_local;
  ulong local_10;
  
  f.stride = stride;
  Write<double>::Write((Write<double> *)local_58,a);
  f.offset = f.stride;
  if (((ulong)(a->shared_alloc_).alloc & 1) == 0) {
    local_10 = ((a->shared_alloc_).alloc)->size;
  }
  else {
    local_10 = (ulong)(a->shared_alloc_).alloc >> 3;
  }
  f.a.shared_alloc_.direct_ptr = (void *)offset;
  parallel_for<Omega_h::fill_linear<double>(Omega_h::Write<double>,double,double)::_lambda(int)_1_>
            ((LO)(local_10 >> 3),(type_conflict2 *)local_58,"Write(size,offset,stride)");
  fill_linear<double>(Omega_h::Write<double>,double,double)::{lambda(int)#1}::~Write
            ((_lambda_int__1_ *)local_58);
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}